

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lb.c
# Opt level: O2

int nn_lb_send(nn_lb *self,nn_msg *msg,nn_pipe **to)

{
  FILE *__stream;
  uint uVar1;
  nn_pipe *self_00;
  char *pcVar2;
  
  self_00 = nn_priolist_getpipe(&self->priolist);
  if (self_00 == (nn_pipe *)0x0) {
    uVar1 = 0xfffffff5;
  }
  else {
    uVar1 = nn_pipe_send(self_00,msg);
    if ((int)uVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(-uVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-uVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/utils/lb.c"
              ,0x4e);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_priolist_advance(&self->priolist,uVar1 & 1);
    if (to != (nn_pipe **)0x0) {
      *to = self_00;
    }
    uVar1 = uVar1 & 0x7ffffffe;
  }
  return uVar1;
}

Assistant:

int nn_lb_send (struct nn_lb *self, struct nn_msg *msg, struct nn_pipe **to)
{
    int rc;
    struct nn_pipe *pipe;

    /*  Pipe is NULL only when there are no avialable pipes. */
    pipe = nn_priolist_getpipe (&self->priolist);
    if (nn_slow (!pipe))
        return -EAGAIN;

    /*  Send the messsage. */
    rc = nn_pipe_send (pipe, msg);
    errnum_assert (rc >= 0, -rc);

    /*  Move to the next pipe. */
    nn_priolist_advance (&self->priolist, rc & NN_PIPE_RELEASE);

    if (to != NULL)
        *to = pipe;

    return rc & ~NN_PIPE_RELEASE;
}